

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O2

bool __thiscall
RoboClaw::SpeedAccelDeccelPositionM1M2
          (RoboClaw *this,uint32_t accel1,uint32_t speed1,uint32_t deccel1,uint32_t position1,
          uint32_t accel2,uint32_t speed2,uint32_t deccel2,uint32_t position2,uint8_t flag)

{
  bool bVar1;
  
  bVar1 = write_n(this,'#',(ulong)this->m_address,0x43,(ulong)(accel1 >> 0x18),
                  (ulong)(accel1 >> 0x10 & 0xff),(ulong)(accel1 >> 8 & 0xff),(ulong)(accel1 & 0xff),
                  (ulong)(speed1 >> 0x18),(ulong)(speed1 >> 0x10 & 0xff),(ulong)(speed1 >> 8 & 0xff)
                  ,(ulong)(speed1 & 0xff),(ulong)(deccel1 >> 0x18),(ulong)(deccel1 >> 0x10 & 0xff),
                  (ulong)(deccel1 >> 8 & 0xff),(ulong)(deccel1 & 0xff),(ulong)(position1 >> 0x18),
                  (ulong)(position1 >> 0x10 & 0xff),(ulong)(position1 >> 8 & 0xff),
                  (ulong)(position1 & 0xff),(ulong)(accel2 >> 0x18),(ulong)(accel2 >> 0x10 & 0xff),
                  (ulong)(accel2 >> 8 & 0xff),(ulong)(accel2 & 0xff),(ulong)(speed2 >> 0x18),
                  (ulong)(speed2 >> 0x10 & 0xff),(ulong)(speed2 >> 8 & 0xff),(ulong)(speed2 & 0xff),
                  (ulong)(deccel2 >> 0x18),(ulong)(deccel2 >> 0x10 & 0xff),
                  (ulong)(deccel2 >> 8 & 0xff),(ulong)(deccel2 & 0xff),(ulong)(position2 >> 0x18),
                  (ulong)(position2 >> 0x10 & 0xff),(ulong)(position2 >> 8 & 0xff),
                  (ulong)(position2 & 0xff),(ulong)flag);
  return bVar1;
}

Assistant:

bool RoboClaw::SpeedAccelDeccelPositionM1M2( uint32_t accel1,uint32_t speed1,uint32_t deccel1,uint32_t position1,uint32_t accel2,uint32_t speed2,uint32_t deccel2,uint32_t position2,uint8_t flag)
{
    return write_n(35, m_address, MIXEDSPEEDACCELDECCELPOS,SetDWORDval(accel1),SetDWORDval(speed1),SetDWORDval(deccel1),SetDWORDval(position1),SetDWORDval(accel2),SetDWORDval(speed2),SetDWORDval(deccel2),SetDWORDval(position2),flag);
}